

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint reed_solomon_find_error_locator(correct_reed_solomon *rs,size_t num_erasures)

{
  undefined1 uVar1;
  undefined4 uVar2;
  field_element_t fVar3;
  field_element_t fVar4;
  long in_RSI;
  long in_RDI;
  int j_4;
  uint temp_order;
  int j_3;
  field_element_t temp;
  int j_2;
  int j_1;
  uint j;
  uint i;
  uint delay_length;
  field_element_t last_discrepancy;
  field_element_t discrepancy;
  uint numerrors;
  undefined4 local_6c;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined1 local_16;
  undefined1 local_15;
  undefined4 local_14;
  
  local_14 = 0;
  memset(*(void **)(in_RDI + 0x90),0,*(long *)(in_RDI + 0x10) + 1);
  **(undefined1 **)(in_RDI + 0x90) = 1;
  *(undefined4 *)(in_RDI + 0x98) = 0;
  memcpy(*(void **)(in_RDI + 0xe0),*(void **)(in_RDI + 0x90),*(long *)(in_RDI + 0x10) + 1);
  *(undefined4 *)(in_RDI + 0xe8) = *(undefined4 *)(in_RDI + 0x98);
  local_16 = '\x01';
  local_1c = 1;
  for (local_20 = *(uint *)(in_RDI + 0x98);
      (ulong)local_20 < (ulong)(*(long *)(in_RDI + 0x10) - in_RSI); local_20 = local_20 + 1) {
    local_15 = *(field_element_t *)(*(long *)(in_RDI + 0x70) + (ulong)local_20);
    for (local_24 = 1; local_24 <= local_14; local_24 = local_24 + 1) {
      fVar3 = field_mul(*(field_t *)(in_RDI + 0x20),
                        *(field_element_t *)(*(long *)(in_RDI + 0x90) + (ulong)local_24),
                        *(field_element_t *)
                         (*(long *)(in_RDI + 0x70) + (ulong)(local_20 - local_24)));
      local_15 = field_add(*(field_t *)(in_RDI + 0x20),local_15,fVar3);
    }
    if (local_15 == '\0') {
      local_1c = local_1c + 1;
    }
    else if (local_20 < local_14 << 1) {
      for (local_3c = *(int *)(in_RDI + 0xe8); -1 < local_3c; local_3c = local_3c + -1) {
        fVar3 = *(field_element_t *)(*(long *)(in_RDI + 0x90) + (ulong)(uint)(local_3c + local_1c));
        fVar4 = field_mul(*(field_t *)(in_RDI + 0x20),
                          *(field_element_t *)(*(long *)(in_RDI + 0xe0) + (long)local_3c),local_15);
        fVar4 = field_div(*(field_t *)(in_RDI + 0x20),fVar4,local_16);
        fVar3 = field_add(*(field_t *)(in_RDI + 0x20),fVar3,fVar4);
        *(field_element_t *)(*(long *)(in_RDI + 0x90) + (ulong)(uint)(local_3c + local_1c)) = fVar3;
      }
      if (*(uint *)(in_RDI + 0x98) < (uint)(*(int *)(in_RDI + 0xe8) + local_1c)) {
        local_6c = *(int *)(in_RDI + 0xe8) + local_1c;
      }
      else {
        local_6c = *(int *)(in_RDI + 0x98);
      }
      *(int *)(in_RDI + 0x98) = local_6c;
      local_1c = local_1c + 1;
    }
    else {
      for (local_28 = *(int *)(in_RDI + 0xe8); local_2c = local_1c, -1 < local_28;
          local_28 = local_28 + -1) {
        fVar3 = field_mul(*(field_t *)(in_RDI + 0x20),
                          *(field_element_t *)(*(long *)(in_RDI + 0xe0) + (long)local_28),local_15);
        fVar3 = field_div(*(field_t *)(in_RDI + 0x20),fVar3,local_16);
        *(field_element_t *)(*(long *)(in_RDI + 0xe0) + (ulong)(uint)(local_28 + local_1c)) = fVar3;
      }
      while (local_2c = local_2c + -1, -1 < local_2c) {
        *(undefined1 *)(*(long *)(in_RDI + 0xe0) + (long)local_2c) = 0;
      }
      for (local_34 = 0; local_34 <= (uint)(*(int *)(in_RDI + 0xe8) + local_1c);
          local_34 = local_34 + 1) {
        uVar1 = *(undefined1 *)(*(long *)(in_RDI + 0x90) + (long)(int)local_34);
        fVar3 = field_add(*(field_t *)(in_RDI + 0x20),
                          *(field_element_t *)(*(long *)(in_RDI + 0x90) + (long)(int)local_34),
                          *(field_element_t *)(*(long *)(in_RDI + 0xe0) + (long)(int)local_34));
        *(field_element_t *)(*(long *)(in_RDI + 0x90) + (long)(int)local_34) = fVar3;
        *(undefined1 *)(*(long *)(in_RDI + 0xe0) + (long)(int)local_34) = uVar1;
      }
      uVar2 = *(undefined4 *)(in_RDI + 0x98);
      *(int *)(in_RDI + 0x98) = *(int *)(in_RDI + 0xe8) + local_1c;
      *(undefined4 *)(in_RDI + 0xe8) = uVar2;
      local_14 = (local_20 + 1) - local_14;
      local_16 = local_15;
      local_1c = 1;
    }
  }
  return *(uint *)(in_RDI + 0x98);
}

Assistant:

static unsigned int reed_solomon_find_error_locator(correct_reed_solomon *rs, size_t num_erasures) {
    unsigned int numerrors = 0;

    memset(rs->error_locator.coeff, 0, (rs->min_distance + 1) * sizeof(field_element_t));

    // initialize to f(x) = 1
    rs->error_locator.coeff[0] = 1;
    rs->error_locator.order = 0;

    memcpy(rs->last_error_locator.coeff, rs->error_locator.coeff, (rs->min_distance + 1) * sizeof(field_element_t));
    rs->last_error_locator.order = rs->error_locator.order;

    field_element_t discrepancy;
    field_element_t last_discrepancy = 1;
    unsigned int delay_length = 1;

    for (unsigned int i = rs->error_locator.order; i < rs->min_distance - num_erasures; i++) {
        discrepancy = rs->syndromes[i];
        for (unsigned int j = 1; j <= numerrors; j++) {
            discrepancy = field_add(rs->field, discrepancy,
                                    field_mul(rs->field, rs->error_locator.coeff[j], rs->syndromes[i - j]));
        }

        if (!discrepancy) {
            // our existing LFSR describes the new syndrome as well
            // leave it as-is but update the number of delay elements
            //   so that if a discrepancy occurs later we can eliminate it
            delay_length++;
            continue;
        }

        if (2 * numerrors <= i) {
            // there's a discrepancy, but we still have room for more taps
            // lengthen LFSR by one tap and set weight to eliminate discrepancy

            // shift the last locator by the delay length, multiply by discrepancy,
            //   and divide by the last discrepancy
            // we move down because we're shifting up, and this prevents overwriting
            for (int j = rs->last_error_locator.order; j >= 0; j--) {
                // the bounds here will be ok since we have a headroom of numerrors
                rs->last_error_locator.coeff[j + delay_length] = field_div(
                    rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy), last_discrepancy);
            }
            for (int j = delay_length - 1; j >= 0; j--) {
                rs->last_error_locator.coeff[j] = 0;
            }

            // locator = locator - last_locator
            // we will also update last_locator to be locator before this loop takes place
            field_element_t temp;
            for (int j = 0; j <= (rs->last_error_locator.order + delay_length); j++) {
                temp = rs->error_locator.coeff[j];
                rs->error_locator.coeff[j] =
                    field_add(rs->field, rs->error_locator.coeff[j], rs->last_error_locator.coeff[j]);
                rs->last_error_locator.coeff[j] = temp;
            }
            unsigned int temp_order = rs->error_locator.order;
            rs->error_locator.order = rs->last_error_locator.order + delay_length;
            rs->last_error_locator.order = temp_order;

            // now last_locator is locator before we started,
            //   and locator is (locator - (discrepancy/last_discrepancy) * x^(delay_length) * last_locator)

            numerrors = i + 1 - numerrors;
            last_discrepancy = discrepancy;
            delay_length = 1;
            continue;
        }

        // no more taps
        // unlike the previous case, we are preserving last locator,
        //    but we'll update locator as before
        // we're basically flattening the two loops from the previous case because
        //    we no longer need to update last_locator
        for (int j = rs->last_error_locator.order; j >= 0; j--) {
            rs->error_locator.coeff[j + delay_length] =
                field_add(rs->field, rs->error_locator.coeff[j + delay_length],
                          field_div(rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy),
                                    last_discrepancy));
        }
        rs->error_locator.order = (rs->last_error_locator.order + delay_length > rs->error_locator.order)
                                      ? rs->last_error_locator.order + delay_length
                                      : rs->error_locator.order;
        delay_length++;
    }
    return rs->error_locator.order;
}